

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O0

void text_out_to_file(uint8_t a,char *str)

{
  bool bVar1;
  wchar_t local_440;
  wchar_t local_43c;
  wchar_t local_438;
  wchar_t i;
  wchar_t l_space;
  wchar_t len;
  wchar_t n;
  wchar_t wrap;
  char buf [1024];
  wchar_t *local_20;
  char *s;
  char *str_local;
  uint8_t a_local;
  
  if (text_out_wrap == L'\0') {
    local_440 = L'K';
  }
  else {
    local_440 = text_out_wrap;
  }
  my_strcpy((char *)&n,str,0x400);
  local_20 = &n;
  do {
    while( true ) {
      if ((char)*local_20 == '\0') {
        return;
      }
      l_space = L'\0';
      i = local_440 - text_out_to_file::pos;
      local_438 = L'\xffffffff';
      if (i < L'\0') {
        i = L'\0';
      }
      if (text_out_to_file::pos == L'\0') {
        for (local_43c = L'\0'; local_43c < text_out_indent; local_43c = local_43c + L'\x01') {
          file_writec(text_out_file,' ');
          text_out_to_file::pos = text_out_to_file::pos + L'\x01';
        }
      }
      while( true ) {
        bVar1 = false;
        if (l_space < i) {
          bVar1 = true;
          if (*(char *)((long)local_20 + (long)l_space) != '\n') {
            bVar1 = *(char *)((long)local_20 + (long)l_space) == '\0';
          }
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if (!bVar1) break;
        if (*(char *)((long)local_20 + (long)l_space) == ' ') {
          local_438 = l_space;
        }
        l_space = l_space + L'\x01';
      }
      if ((local_438 == L'\xffffffff') && (l_space == i)) break;
      if ((*(char *)((long)local_20 + (long)l_space) == '\n') ||
         (*(char *)((long)local_20 + (long)l_space) == '\0')) {
        i = l_space;
      }
      else {
        i = local_438;
      }
LAB_00269647:
      file_write(text_out_file,(char *)local_20,(long)i);
      text_out_to_file::pos = i + text_out_to_file::pos;
      local_20 = (wchar_t *)((long)local_20 + (long)i);
      if ((char)*local_20 == '\0') {
        return;
      }
      if ((char)*local_20 == '\n') {
        local_20 = (wchar_t *)((long)local_20 + 1);
      }
      file_writec(text_out_file,'\n');
      text_out_to_file::pos = L'\0';
      for (; (char)*local_20 == ' '; local_20 = (wchar_t *)((long)local_20 + 1)) {
      }
    }
    if (text_out_to_file::pos == text_out_indent) {
      i = l_space;
      goto LAB_00269647;
    }
    if ((((char)*local_20 == ' ') || ((char)*local_20 == ',')) || ((char)*local_20 == '.')) {
      i = L'\x01';
      goto LAB_00269647;
    }
    file_writec(text_out_file,'\n');
    text_out_to_file::pos = L'\0';
  } while( true );
}

Assistant:

void text_out_to_file(uint8_t a, const char *str)
{
	const char *s;
	char buf[1024];

	/* Current position on the line */
	static int pos = 0;

	/* Wrap width */
	int wrap = (text_out_wrap ? text_out_wrap : 75);

	/* Unused parameter */
	(void)a;

	/* Copy to a rewriteable string */
 	my_strcpy(buf, str, 1024);

	/* Current location within "buf" */
 	s = buf;

	/* Process the string */
	while (*s) {
		int n = 0;
		int len = wrap - pos;
		int l_space = -1;

		/* In case we are already past the wrap point (which can happen with
		 * punctuation at the end of the line), make sure we don't overrun.
		 */
		if (len < 0)
			len = 0;

		/* If we are at the start of the line... */
		if (pos == 0) {
			int i;

			/* Output the indent */
			for (i = 0; i < text_out_indent; i++) {
				file_writec(text_out_file, ' ');
				pos++;
			}
		}

		/* Find length of line up to next newline or end-of-string */
		while ((n < len) && !((s[n] == '\n') || (s[n] == '\0'))) {
			/* Mark the most recent space in the string */
			if (s[n] == ' ') l_space = n;

			/* Increment */
			n++;
		}

		/* If we have encountered no spaces */
		if ((l_space == -1) && (n == len)) {
			/* If we are at the start of a new line */
			if (pos == text_out_indent) {
				len = n;
			} else if ((s[0] == ' ') || (s[0] == ',') || (s[0] == '.')) {
				/* HACK - Output punctuation at the end of the line */
				len = 1;
			} else {
				/* Begin a new line */
				file_writec(text_out_file, '\n');

				/* Reset */
				pos = 0;

				continue;
			}
		} else {
			/* Wrap at the newline */
			if ((s[n] == '\n') || (s[n] == '\0')) len = n;

			/* Wrap at the last space */
			else len = l_space;
		}

		/* Write that line to file */
		file_write(text_out_file, s, len);
		pos += len;

		/* Move 's' past the stuff we've written */
		s += len;

		/* If we are at the end of the string, end */
		if (*s == '\0') return;

		/* Skip newlines */
		if (*s == '\n') s++;

		/* Begin a new line */
		file_writec(text_out_file, '\n');

		/* Reset */
		pos = 0;

		/* Skip whitespace */
		while (*s == ' ') s++;
	}

	/* We are done */
	return;
}